

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

Tim_Man_t * Tim_ManDup(Tim_Man_t *p,int fUnitDelay)

{
  Tim_Obj_t *pTVar1;
  float *pfVar2;
  void *pvVar3;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  
  iVar10 = p->nCis;
  if ((0 < (long)iVar10) && (pTVar1 = p->pCis, pTVar1 != (Tim_Obj_t *)0x0)) {
    lVar8 = 0;
    do {
      *(undefined4 *)((long)&pTVar1->TravId + lVar8) = 0;
      lVar8 = lVar8 + 0x18;
    } while ((long)iVar10 * 0x18 != lVar8);
  }
  iVar7 = p->nCos;
  if ((0 < (long)iVar7) && (pTVar1 = p->pCos, pTVar1 != (Tim_Obj_t *)0x0)) {
    lVar8 = 0;
    do {
      *(undefined4 *)((long)&pTVar1->TravId + lVar8) = 0;
      lVar8 = lVar8 + 0x18;
    } while ((long)iVar7 * 0x18 != lVar8);
  }
  p_00 = Tim_ManStart(iVar10,iVar7);
  memcpy(p_00->pCis,p->pCis,(long)p->nCis * 0x18);
  memcpy(p_00->pCos,p->pCos,(long)p->nCos * 0x18);
  if (fUnitDelay != 0) {
    Tim_ManInitPiArrivalAll(p,0.0);
    Tim_ManInitPoRequiredAll(p,1e+09);
  }
  pVVar4 = p->vDelayTables;
  if ((pVVar4 != (Vec_Ptr_t *)0x0) && (0 < pVVar4->nSize)) {
    iVar10 = pVVar4->nSize;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    iVar7 = 8;
    if (6 < iVar10 - 1U) {
      iVar7 = iVar10;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar7;
    if (iVar7 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)iVar7 << 3);
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nSize = iVar10;
    memset(ppvVar5,0,(long)iVar10 << 3);
    p_00->vDelayTables = pVVar4;
    pVVar4 = p->vDelayTables;
    if (0 < pVVar4->nSize) {
      uVar12 = 0;
      do {
        pfVar2 = (float *)pVVar4->pArray[uVar12];
        if (pfVar2 != (float *)0x0) {
          fVar14 = *pfVar2;
          if (uVar12 != (uint)(int)fVar14) {
            __assert_fail("i == (int)pDelayTable[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0x7b,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
          }
          uVar11 = (int)pfVar2[2] * (int)pfVar2[1];
          pfVar6 = (float *)malloc((long)(int)uVar11 * 4 + 0xc);
          *pfVar6 = (float)(int)fVar14;
          pfVar6[1] = (float)(int)pfVar2[1];
          pfVar6[2] = (float)(int)pfVar2[2];
          if (0 < (int)uVar11) {
            uVar9 = 0;
            do {
              fVar14 = pfVar2[uVar9 + 3];
              if (fUnitDelay != 0) {
                fVar14 = (float)fUnitDelay;
              }
              uVar13 = -(uint)(pfVar2[uVar9 + 3] == -1e+09);
              pfVar6[uVar9 + 3] = (float)(uVar13 & 0xce6e6b28 | ~uVar13 & (uint)fVar14);
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          if ((long)p_00->vDelayTables->nSize <= (long)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar5 = p_00->vDelayTables->pArray;
          if (ppvVar5[uVar12] != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0x88,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
          }
          ppvVar5[uVar12] = pfVar6;
        }
        uVar12 = uVar12 + 1;
        pVVar4 = p->vDelayTables;
      } while ((long)uVar12 < (long)pVVar4->nSize);
    }
  }
  pVVar4 = p->vBoxes;
  if ((pVVar4 != (Vec_Ptr_t *)0x0) && (0 < pVVar4->nSize)) {
    if (pVVar4 == (Vec_Ptr_t *)0x0) {
      iVar10 = 0;
    }
    else {
      iVar10 = pVVar4->nSize;
    }
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    iVar7 = 8;
    if (6 < iVar10 - 1U) {
      iVar7 = iVar10;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar7;
    if (iVar7 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)iVar7 << 3);
    }
    pVVar4->pArray = ppvVar5;
    p_00->vBoxes = pVVar4;
    pVVar4 = p->vBoxes;
    if (0 < pVVar4->nSize) {
      lVar8 = 0;
      do {
        pvVar3 = pVVar4->pArray[lVar8];
        Tim_ManCreateBox(p_00,*(int *)((long)pvVar3 + 0x1c),*(int *)((long)pvVar3 + 8),
                         *(int *)((long)pvVar3 + (long)*(int *)((long)pvVar3 + 8) * 4 + 0x1c),
                         *(int *)((long)pvVar3 + 0xc),*(int *)((long)pvVar3 + 0x10),
                         *(int *)((long)pvVar3 + 0x18));
        Tim_ManBoxSetCopy(p_00,(int)lVar8,*(int *)((long)pvVar3 + 0x14));
        lVar8 = lVar8 + 1;
        pVVar4 = p->vBoxes;
      } while (lVar8 < pVVar4->nSize);
    }
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManDup( Tim_Man_t * p, int fUnitDelay )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nInputs, nOutputs;
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( p->nCis, p->nCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * p->nCis ); 
    memcpy( pNew->pCos, p->pCos, sizeof(Tim_Obj_t) * p->nCos ); 
    if ( fUnitDelay )
    {
        // discretize PI arrival times
//        Tim_ManForEachPi( pNew, pObj, k )
//          pObj->timeArr = (int)pObj->timeArr;
        // discretize PO required times
//        Tim_ManForEachPo( pNew, pObj, k )
//          pObj->timeReq = 1 + (int)pObj->timeReq;
        // clear PI arrival and PO required
        Tim_ManInitPiArrivalAll( p, 0.0 );
        Tim_ManInitPoRequiredAll( p, (float)TIM_ETERNITY );
    }
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
				if ( pDelayTable[3+k] == -ABC_INFINITY )
					pDelayTableNew[3+k] = -ABC_INFINITY;
				else
					pDelayTableNew[3+k] = fUnitDelay ? (float)fUnitDelay : pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
//printf( "Finished duplicating delay table %d.\n", i );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
        {
           Tim_ManCreateBox( pNew, pBox->Inouts[0], pBox->nInputs, 
                pBox->Inouts[pBox->nInputs], pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
           Tim_ManBoxSetCopy( pNew, i, pBox->iCopy );
        }
    }
    return pNew;
}